

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_distFcnElement.cpp
# Opt level: O0

distFcnElement2d * __thiscall
amrex::SplineDistFcnElement2d::newDistFcnElement2d(SplineDistFcnElement2d *this)

{
  distFcnElement2d *pdVar1;
  SplineDistFcnElement2d *in_RDI;
  SplineDistFcnElement2d *newSpline;
  vector<double,_std::allocator<double>_> *in_stack_00000068;
  vector<double,_std::allocator<double>_> *in_stack_00000070;
  
  pdVar1 = (distFcnElement2d *)operator_new(0x98);
  SplineDistFcnElement2d(in_RDI);
  std::vector<double,_std::allocator<double>_>::operator=(in_stack_00000070,in_stack_00000068);
  std::vector<double,_std::allocator<double>_>::operator=(in_stack_00000070,in_stack_00000068);
  pdVar1[7]._vptr_distFcnElement2d = (_func_int **)(in_RDI->bc_pt_start).vect[0];
  pdVar1[8]._vptr_distFcnElement2d = (_func_int **)(in_RDI->bc_pt_start).vect[1];
  pdVar1[9]._vptr_distFcnElement2d = (_func_int **)(in_RDI->bc_pt_start).vect[2];
  pdVar1[10]._vptr_distFcnElement2d = (_func_int **)(in_RDI->bc_pt_end).vect[0];
  pdVar1[0xb]._vptr_distFcnElement2d = (_func_int **)(in_RDI->bc_pt_end).vect[1];
  pdVar1[0xc]._vptr_distFcnElement2d = (_func_int **)(in_RDI->bc_pt_end).vect[2];
  std::vector<double,_std::allocator<double>_>::operator=(in_stack_00000070,in_stack_00000068);
  std::vector<double,_std::allocator<double>_>::operator=(in_stack_00000070,in_stack_00000068);
  return pdVar1;
}

Assistant:

distFcnElement2d* SplineDistFcnElement2d::newDistFcnElement2d() const {
  SplineDistFcnElement2d* newSpline = new SplineDistFcnElement2d();
  newSpline->control_points_x = control_points_x;
  newSpline->control_points_y = control_points_y;
  newSpline->bc_pt_start = bc_pt_start;
  newSpline->bc_pt_end = bc_pt_end;
  newSpline->Dx = Dx;
  newSpline->Dy = Dy;
  return static_cast<distFcnElement2d*>(newSpline);
}